

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue JS_GetGlobalVar(JSContext *ctx,JSAtom prop,BOOL throw_ref_error)

{
  void *pvVar1;
  JSShape *sh_00;
  uint uVar2;
  int iVar3;
  uint32_t *puVar4;
  JSShapeProperty *pJVar5;
  uint in_ESI;
  JSContext *in_RDI;
  JSProperty *pr;
  JSShapeProperty *prs;
  JSObject *p;
  intptr_t h;
  JSShapeProperty *prop_1;
  JSShapeProperty *pr_1;
  JSShape *sh;
  JSAtom in_stack_000000cc;
  JSContext *in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  undefined1 in_stack_000000e8 [16];
  BOOL in_stack_00000170;
  JSValue *local_78;
  JSValue local_50;
  ulong local_40;
  JSContext *in_stack_ffffffffffffffd0;
  JSContext *local_8;
  
  pvVar1 = (in_RDI->global_var_obj).u.ptr;
  sh_00 = *(JSShape **)((long)pvVar1 + 0x18);
  uVar2 = sh_00->prop_hash_mask;
  puVar4 = prop_hash_end(sh_00);
  uVar2 = puVar4[-1 - (ulong)(in_ESI & uVar2)];
  pJVar5 = get_shape_prop(sh_00);
  do {
    local_40 = (ulong)uVar2;
    if (local_40 == 0) {
      local_78 = (JSValue *)0x0;
      local_8 = (JSContext *)0x0;
LAB_0015d143:
      if (local_8 == (JSContext *)0x0) {
        local_50 = JS_GetPropertyInternal
                             (in_stack_000000d0,(JSValue)in_stack_000000e8,in_stack_000000cc,
                              (JSValue)in_stack_000000d8,in_stack_00000170);
      }
      else {
        iVar3 = JS_IsUninitialized(*local_78);
        if (iVar3 == 0) {
          local_50 = JS_DupValue(in_RDI,*local_78);
        }
        else {
          local_50 = JS_ThrowReferenceErrorUninitialized
                               (in_stack_ffffffffffffffd0,(JSAtom)((ulong)pJVar5 >> 0x20));
        }
      }
      return local_50;
    }
    in_stack_ffffffffffffffd0 = (JSContext *)(pJVar5 + (local_40 - 1));
    if (*(JSAtom *)&(in_stack_ffffffffffffffd0->header).field_0x4 == in_ESI) {
      local_78 = (JSValue *)(*(long *)((long)pvVar1 + 0x20) + (local_40 - 1) * 0x10);
      local_8 = in_stack_ffffffffffffffd0;
      goto LAB_0015d143;
    }
    uVar2 = (in_stack_ffffffffffffffd0->header).ref_count & 0x3ffffff;
  } while( true );
}

Assistant:

static JSValue JS_GetGlobalVar(JSContext *ctx, JSAtom prop,
                               BOOL throw_ref_error)
{
    JSObject *p;
    JSShapeProperty *prs;
    JSProperty *pr;

    /* no exotic behavior is possible in global_var_obj */
    p = JS_VALUE_GET_OBJ(ctx->global_var_obj);
    prs = find_own_property(&pr, p, prop);
    if (prs) {
        /* XXX: should handle JS_PROP_TMASK properties */
        if (unlikely(JS_IsUninitialized(pr->u.value)))
            return JS_ThrowReferenceErrorUninitialized(ctx, prs->atom);
        return JS_DupValue(ctx, pr->u.value);
    }
    return JS_GetPropertyInternal(ctx, ctx->global_obj, prop,
                                 ctx->global_obj, throw_ref_error);
}